

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

uint fmt::v5::internal::
     parse_nonnegative_int<fmt::v5::internal::null_terminating_iterator<char>,fmt::v5::internal::id_adapter<fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>&,char>&>
               (null_terminating_iterator<char> *it,
               id_adapter<fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_&,_char>
               *eh)

{
  byte *pbVar1;
  byte bVar2;
  uint uVar3;
  
  pbVar1 = (byte *)it->ptr_;
  if ((pbVar1 == (byte *)it->end_) || (bVar2 = *pbVar1, 9 < (byte)(bVar2 - 0x30))) {
    __assert_fail("\'0\' <= *it && *it <= \'9\'",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianparpart[P]flow/3rdparty/fmt/include/fmt/format.h"
                  ,0x65d,
                  "unsigned int fmt::internal::parse_nonnegative_int(Iterator &, ErrorHandler &&) [Iterator = fmt::internal::null_terminating_iterator<char>, ErrorHandler = fmt::internal::id_adapter<fmt::format_handler<fmt::arg_formatter<fmt::back_insert_range<fmt::internal::basic_buffer<char>>>, char, fmt::basic_format_context<std::back_insert_iterator<fmt::internal::basic_buffer<char>>, char>> &, char> &]"
                 );
  }
  uVar3 = 0;
  do {
    pbVar1 = pbVar1 + 1;
    if (0xccccccc < uVar3) {
      uVar3 = 0x80000000;
      goto LAB_00117dd3;
    }
    uVar3 = ((uint)bVar2 + uVar3 * 10) - 0x30;
    it->ptr_ = (char *)pbVar1;
  } while ((pbVar1 != (byte *)it->end_) && (bVar2 = *pbVar1, (byte)(bVar2 - 0x30) < 10));
  if ((int)uVar3 < 0) {
LAB_00117dd3:
    id_adapter<fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_&,_char>
    ::on_error(eh,"number is too big");
  }
  return uVar3;
}

Assistant:

FMT_CONSTEXPR Char operator*() const {
    return ptr_ != end_ ? *ptr_ : 0;
  }